

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void do_fix_all(Am_Value_List *list,Am_Object *inter)

{
  bool bVar1;
  Am_Value *in_value;
  char *s;
  Am_Wrapper *value;
  Am_Value local_78;
  Am_Input_Char local_64;
  Am_String local_60;
  char *local_58;
  char *str_1;
  Am_String str;
  Am_Input_Char ic;
  undefined1 local_38 [8];
  Am_Value item;
  Am_Value_List new_list;
  Am_Object *inter_local;
  Am_Value_List *list_local;
  
  Am_Value_List::Am_Value_List((Am_Value_List *)&item.value);
  Am_Value::Am_Value((Am_Value *)local_38);
  Am_Input_Char::Am_Input_Char
            ((Am_Input_Char *)&str,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  Am_String::Am_String((Am_String *)&str_1);
  Am_Value_List::Start(list);
  while( true ) {
    bVar1 = Am_Value_List::Last(list);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_value = Am_Value_List::Get(list);
    Am_Value::operator=((Am_Value *)local_38,in_value);
    if (local_38._0_2_ == 0x8008) {
      Am_String::Am_String(&local_60,(Am_Value *)local_38);
      s = Am_String::operator_cast_to_char_(&local_60);
      Am_String::~Am_String(&local_60);
      local_58 = s;
      Am_Input_Char::Am_Input_Char(&local_64,s,true);
      Am_Input_Char::operator=((Am_Input_Char *)&str,&local_64);
    }
    else {
      Am_Input_Char::operator=((Am_Input_Char *)&str,(Am_Value *)local_38);
    }
    Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&local_78);
    Am_Value_List::Add((Am_Value_List *)&item.value,&local_78,Am_TAIL,true);
    Am_Value::~Am_Value(&local_78);
    Am_Value_List::Next(list);
  }
  value = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&item.value);
  Am_Object::Set(inter,0x196,value,0x10000);
  Am_Value_List::operator=(list,(Am_Value_List *)&item.value);
  Am_String::~Am_String((Am_String *)&str_1);
  Am_Value::~Am_Value((Am_Value *)local_38);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&item.value);
  return;
}

Assistant:

void
do_fix_all(Am_Value_List &list, Am_Object &inter)
{
  Am_Value_List new_list;
  Am_Value item;
  Am_Input_Char ic;
  Am_String str;
  for (list.Start(); !list.Last(); list.Next()) {
    item = list.Get();
    if (item.type == Am_STRING) {
      const char *str = (Am_String)item;
      ic = Am_Input_Char(str);
    } else
      ic = item;
    new_list.Add(ic);
  }
  inter.Set(Am_SELECTION_MOVE_CHARS, new_list, Am_KEEP_FORMULAS);
  list = new_list;
}